

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadHandler.cxx
# Opt level: O0

int __thiscall cmCTestUploadHandler::ProcessHandler(cmCTestUploadHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  reference pbVar5;
  string local_890;
  allocator local_869;
  string local_868;
  allocator local_841;
  string local_840;
  string local_820 [32];
  undefined1 local_800 [8];
  ostringstream cmCTestLog_msg_1;
  _Self local_688;
  _Base_ptr local_680;
  allocator local_671;
  string local_670;
  allocator local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  allocator local_601;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  allocator local_539;
  string local_538;
  undefined1 local_518 [8];
  cmXMLWriter xml;
  const_iterator it;
  string local_4b8;
  string local_498;
  undefined1 local_478 [8];
  string buildname;
  string local_450 [32];
  undefined1 local_430 [8];
  ostringstream cmCTestLog_msg;
  allocator local_2b1;
  string local_2b0;
  string local_280;
  undefined1 local_260 [8];
  cmGeneratedFileStream ofs;
  cmCTestUploadHandler *this_local;
  
  ofs._576_8_ = this;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_260,None);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_280,pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"Upload.xml",&local_2b1);
  bVar2 = cmCTest::OpenOutputFile
                    (pcVar1,&local_280,&local_2b0,(cmGeneratedFileStream *)local_260,false);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string((string *)&local_280);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4b8,"BuildName",(allocator *)((long)&it._M_node + 7));
    cmCTest::GetCTestConfiguration(&local_498,pcVar1,&local_4b8);
    cmCTest::SafeBuildIdField((string *)local_478,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&xml.ElementOpen);
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_518,(ostream *)local_260,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_518,"UTF-8");
    cmXMLWriter::ProcessingInstruction
              ((cmXMLWriter *)local_518,"xml-stylesheet",
               "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_538,"Site",&local_539);
    cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_518,"BuildName",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478);
    cmCTest::GetCurrentTag_abi_cxx11_(&local_5a0,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_580,&local_5a0,"-");
    cmCTest::GetTestModelString_abi_cxx11_(&local_5c0,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_560,&local_580,&local_5c0);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"BuildStamp",&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5a0);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_600,"Site",&local_601);
    cmCTest::GetCTestConfiguration(&local_5e0,pcVar1,&local_600);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"Name",&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator((allocator<char> *)&local_601);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_648,"ctest",&local_649);
    pcVar3 = cmVersion::GetCMakeVersion();
    std::operator+(&local_628,&local_648,pcVar3);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"Generator",&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    cmCTest::AddSiteProperties((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_518);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_670,"Upload",&local_671);
    cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator((allocator<char> *)&local_671);
    local_680 = (_Base_ptr)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&this->Files);
    xml._72_8_ = local_680;
    while( true ) {
      local_688._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Files);
      bVar2 = std::operator!=((_Self *)&xml.ElementOpen,&local_688);
      if (!bVar2) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_800);
      poVar4 = std::operator<<((ostream *)local_800,"\tUpload file: ");
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&xml.ElementOpen);
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                   ,0x3c,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_820);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_800);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_840,"File",&local_841);
      cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::allocator<char>::~allocator((allocator<char> *)&local_841);
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&xml.ElementOpen);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_518,"filename",pbVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_868,"Content",&local_869);
      cmXMLWriter::StartElement((cmXMLWriter *)local_518,&local_868);
      std::__cxx11::string::~string((string *)&local_868);
      std::allocator<char>::~allocator((allocator<char> *)&local_869);
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_518,"encoding",(char (*) [7])"base64");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&xml.ElementOpen);
      cmCTest::Base64EncodeFile(&local_890,pcVar1,pbVar5);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_518,&local_890);
      std::__cxx11::string::~string((string *)&local_890);
      cmXMLWriter::EndElement((cmXMLWriter *)local_518);
      cmXMLWriter::EndElement((cmXMLWriter *)local_518);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&xml.ElementOpen,0);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_518);
    cmXMLWriter::EndElement((cmXMLWriter *)local_518);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_518);
    this_local._4_4_ = 0;
    buildname.field_2._12_4_ = 1;
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_518);
    std::__cxx11::string::~string((string *)local_478);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
    poVar4 = std::operator<<((ostream *)local_430,"Cannot open Upload.xml file");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                 ,0x23,pcVar3,false);
    std::__cxx11::string::~string(local_450);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
    this_local._4_4_ = -1;
    buildname.field_2._12_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  return this_local._4_4_;
}

Assistant:

int cmCTestUploadHandler::ProcessHandler()
{
  cmGeneratedFileStream ofs;
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), "Upload.xml",
                                   ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open Upload.xml file"
                 << std::endl);
    return -1;
  }
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));
  cmCTest::SetOfStrings::const_iterator it;

  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp", this->CTest->GetCurrentTag() + "-" +
                  this->CTest->GetTestModelString());
  xml.Attribute("Name", this->CTest->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest") + cmVersion::GetCMakeVersion());
  this->CTest->AddSiteProperties(xml);
  xml.StartElement("Upload");

  for (it = this->Files.begin(); it != this->Files.end(); it++) {
    cmCTestOptionalLog(this->CTest, OUTPUT,
                       "\tUpload file: " << *it << std::endl, this->Quiet);
    xml.StartElement("File");
    xml.Attribute("filename", *it);
    xml.StartElement("Content");
    xml.Attribute("encoding", "base64");
    xml.Content(this->CTest->Base64EncodeFile(*it));
    xml.EndElement(); // Content
    xml.EndElement(); // File
  }
  xml.EndElement(); // Upload
  xml.EndElement(); // Site
  xml.EndDocument();
  return 0;
}